

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

float NGA_Fdot_patch64(int g_a,char t_a,int64_t *alo,int64_t *ahi,int g_b,char t_b,int64_t *blo,
                      int64_t *bhi)

{
  long in_RCX;
  long in_RDX;
  int in_EDI;
  int in_R8D;
  long in_stack_00000008;
  long in_stack_00000010;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  Integer bndim;
  Integer b;
  Integer andim;
  Integer a;
  float res;
  char *in_stack_00000808;
  Integer in_stack_00000810;
  Integer *in_stack_00000818;
  Integer *in_stack_00000820;
  char *in_stack_00000828;
  Integer in_stack_00000830;
  Integer *in_stack_00000840;
  Integer *in_stack_00000848;
  void *in_stack_00000850;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  long local_148 [8];
  long local_108 [8];
  long local_c8 [8];
  long local_88 [8];
  Integer local_48;
  long local_40;
  Integer local_38;
  long local_30;
  float local_24;
  int local_1c;
  long local_18;
  long local_10;
  
  local_30 = (long)in_EDI;
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_38 = pnga_ndim(_ga_blo[2]);
  local_40 = (long)local_1c;
  local_48 = pnga_ndim(_ga_blo[2]);
  for (local_14c = 0; local_14c < local_38; local_14c = local_14c + 1) {
    local_88[(local_38 - local_14c) + -1] = *(long *)(local_10 + (long)local_14c * 8) + 1;
  }
  for (local_150 = 0; local_150 < local_38; local_150 = local_150 + 1) {
    local_c8[(local_38 - local_150) + -1] = *(long *)(local_18 + (long)local_150 * 8) + 1;
  }
  for (local_154 = 0; local_154 < local_48; local_154 = local_154 + 1) {
    local_108[(local_48 - local_154) + -1] = *(long *)(in_stack_00000008 + (long)local_154 * 8) + 1;
  }
  for (local_158 = 0; local_158 < local_48; local_158 = local_158 + 1) {
    local_148[(local_48 - local_158) + -1] = *(long *)(in_stack_00000010 + (long)local_158 * 8) + 1;
  }
  pnga_dot_patch(in_stack_00000830,in_stack_00000828,in_stack_00000820,in_stack_00000818,
                 in_stack_00000810,in_stack_00000808,in_stack_00000840,in_stack_00000848,
                 in_stack_00000850);
  return local_24;
}

Assistant:

float NGA_Fdot_patch64(int g_a, char t_a, int64_t alo[], int64_t ahi[],
                       int g_b, char t_b, int64_t blo[], int64_t bhi[])
{
    float res;
    Integer a=(Integer)g_a;
    Integer andim = wnga_ndim(a);
 
    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);
 
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
 
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
 
    wnga_dot_patch(a, &t_a, _ga_alo, _ga_ahi,
                   b, &t_b, _ga_blo, _ga_bhi, &res);
 
    return res;
}